

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O3

void Gia_ManPrintBarBufDrivers(Gia_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uVar4;
  uint uVar5;
  void *__s;
  void *__s_00;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int Entry;
  int CountFans [2];
  int CountCrit [2];
  undefined8 local_48;
  ulong local_40;
  Vec_Int_t *local_38;
  
  local_40 = 0;
  local_48 = 0;
  uVar2 = p->nObjs;
  lVar14 = (long)(int)uVar2;
  uVar5 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar5 = uVar2;
  }
  if (uVar5 == 0) {
    __s = (void *)0x0;
    memset((void *)0x0,0,lVar14 << 2);
    __s_00 = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar5 << 2);
    memset(__s,0,lVar14 << 2);
    __s_00 = malloc((long)(int)uVar5 << 2);
  }
  memset(__s_00,0,lVar14 << 2);
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  uVar11 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    lVar14 = 0;
    iVar13 = 0;
    uVar11 = 0;
    uVar5 = uVar2;
    local_38 = pVVar6;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(ulong *)(&p->pObjs->field_0x0 + lVar14);
      uVar8 = (uint)uVar3;
      uVar9 = uVar8 & 0x1fffffff;
      uVar10 = (uint)(uVar3 >> 0x20) & 0x1fffffff;
      Entry = (int)uVar11;
      if (((((int)uVar8 < 0) || (uVar9 == 0x1fffffff)) || (uVar9 != uVar10)) &&
         ((uVar3 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar8)) {
        if (-1 < (int)uVar8 && (int)(uVar3 & 0x1fffffff) != 0x1fffffff) {
          if (uVar2 <= Entry - uVar9) {
LAB_001d310f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar7 = (int *)((long)__s_00 + (ulong)(Entry - uVar9) * 4);
          *piVar7 = *piVar7 + 1;
          if (((int)(Entry - uVar10) < 0) || (uVar2 <= Entry - uVar10)) goto LAB_001d310f;
          uVar12 = Entry - uVar10;
          goto LAB_001d2f2a;
        }
      }
      else {
        uVar12 = Entry - uVar9;
        if (uVar2 <= uVar12) goto LAB_001d310f;
LAB_001d2f2a:
        piVar7 = (int *)((long)__s_00 + (ulong)uVar12 * 4);
        *piVar7 = *piVar7 + 1;
      }
      if (((-1 < (int)uVar8) && (uVar9 != 0x1fffffff)) && (uVar9 == uVar10)) {
        if (uVar11 != (uVar8 & 0x1fffffff)) {
          uVar9 = Entry - uVar9;
          if (uVar2 <= uVar9) goto LAB_001d312e;
          if (*(int *)((long)__s + (ulong)uVar9 * 4) == 0) {
            *(uint *)((long)__s + (ulong)uVar9 * 4) = iVar13 + (uint)((uVar8 >> 0x1d & 1) != 0);
            goto LAB_001d2f8e;
          }
        }
        piVar7 = (int *)((long)&local_40 + (ulong)(uVar11 != (uVar8 & 0x1fffffff)) * 4);
        *piVar7 = *piVar7 + 1;
        Vec_IntPush(local_38,Entry);
        uVar5 = p->nObjs;
      }
LAB_001d2f8e:
      uVar11 = uVar11 + 1;
      iVar13 = iVar13 + 2;
      lVar14 = lVar14 + 0xc;
    } while ((long)uVar11 < (long)(int)uVar5);
    iVar13 = local_38->nSize;
    pVVar6 = local_38;
    if ((long)iVar13 < 1) {
      uVar5 = 0;
      uVar11 = 0;
    }
    else {
      piVar7 = local_38->pArray;
      uVar11 = 0;
      do {
        uVar8 = piVar7[uVar11];
        if (((long)(int)uVar8 < 0) || ((int)uVar5 <= (int)uVar8)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar4 = *(undefined8 *)(p->pObjs + (int)uVar8);
        uVar9 = (uint)uVar4;
        if ((((int)uVar9 < 0) || (uVar9 = uVar9 & 0x1fffffff, uVar9 == 0x1fffffff)) ||
           (uVar9 != ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff))) {
          __assert_fail("Gia_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                        ,0xf8,"void Gia_ManPrintBarBufDrivers(Gia_Man_t *)");
        }
        if (uVar2 == uVar11) {
LAB_001d312e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*(int *)((long)__s_00 + uVar11 * 4) != 0) {
          piVar1 = (int *)((long)&local_48 + (ulong)(uVar8 != uVar9) * 4);
          *piVar1 = *piVar1 + 1;
        }
        uVar11 = uVar11 + 1;
      } while ((long)iVar13 != uVar11);
      uVar11 = local_48 & 0xffffffff;
      uVar5 = local_48._4_4_;
    }
  }
  printf("Detected %d const (out of %d) and %d shared (out of %d) barbufs with fanout.\n",uVar11,
         local_40 & 0xffffffff,(ulong)uVar5,local_40 >> 0x20);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
  }
  free(pVVar6);
  return;
}

Assistant:

void Gia_ManPrintBarBufDrivers( Gia_Man_t * p )
{
    Vec_Int_t * vMap, * vFan, * vCrits;
    Gia_Obj_t * pObj;
    int i, iFanin, CountCrit[2] = {0}, CountFans[2] = {0};
    // map barbuf drivers into barbuf literals of the first barbuf driven by them
    vMap = Vec_IntStart( Gia_ManObjNum(p) );
    vFan = Vec_IntStart( Gia_ManObjNum(p) );
    vCrits = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
    {
        // count fanouts
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjIsCo(pObj) )
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId0(pObj, i), 1 );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId0(pObj, i), 1 );
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId1(pObj, i), 1 );
        }
        // count critical barbufs
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0( pObj, i );
            if ( iFanin == 0 || Vec_IntEntry(vMap, iFanin) != 0 )
            {
                CountCrit[(int)(iFanin != 0)]++;
                Vec_IntPush( vCrits, i );
                continue;
            }
            Vec_IntWriteEntry( vMap, iFanin, Abc_Var2Lit(i, Gia_ObjFaninC0(pObj)) );
        }
    }
    // check fanouts of the critical barbufs
    Gia_ManForEachObjVec( vCrits, p, pObj, i )
    {
        assert( Gia_ObjIsBuf(pObj) );
        if ( Vec_IntEntry(vFan, i) == 0 )
            continue;
        iFanin = Gia_ObjFaninId0p( p, pObj );
        CountFans[(int)(iFanin != 0)]++;
    }
    printf( "Detected %d const (out of %d) and %d shared (out of %d) barbufs with fanout.\n", 
        CountFans[0], CountCrit[0], CountFans[1], CountCrit[1] );
    Vec_IntFree( vMap );
    Vec_IntFree( vFan );
    Vec_IntFree( vCrits );
}